

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O2

int c1fgkf_(int *ido,int *ip,int *l1,int *lid,int *na,double *cc,double *cc1,int *in1,double *ch,
           double *ch1,int *in2,double *wa)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  double *pdVar12;
  double *pdVar13;
  double *pdVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  double *pdVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  double *pdVar29;
  uint uVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  ulong uVar36;
  ulong uVar37;
  long lVar38;
  long lVar39;
  double *pdVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  bool bVar48;
  double dVar49;
  
  iVar5 = *ido;
  lVar35 = (long)iVar5;
  iVar6 = *ip;
  lVar32 = (long)iVar6;
  uVar30 = ~(iVar6 * iVar5);
  iVar11 = *in1;
  lVar31 = (long)iVar11;
  uVar7 = *lid;
  lVar25 = (long)(int)uVar7;
  lVar27 = (long)(int)~((uVar7 + 1) * iVar11);
  uVar8 = *l1;
  lVar39 = (long)(int)uVar8;
  lVar22 = (long)(int)(~(uVar8 * (iVar6 + 1)) * iVar11 + -1);
  iVar11 = *in2;
  lVar33 = (long)iVar11;
  lVar43 = (long)(int)~((uVar7 + 1) * iVar11);
  uVar20 = iVar5 + 1;
  lVar15 = (long)(int)(~(uVar8 * uVar20) * iVar11 + -1);
  uVar9 = 0;
  if (0 < (int)uVar7) {
    uVar9 = uVar7;
  }
  uVar36 = (ulong)uVar9;
  lVar44 = (lVar25 + 1) * lVar33;
  lVar16 = (lVar25 + 1) * lVar31;
  pdVar14 = ch1 + lVar44 + lVar43 + 2;
  pdVar19 = cc1 + lVar27 + lVar16 + 2;
  lVar1 = lVar31 * 8;
  uVar37 = uVar36;
  while (bVar48 = uVar37 != 0, uVar37 = uVar37 - 1, bVar48) {
    pdVar14[-1] = pdVar19[-1];
    *pdVar14 = *pdVar19;
    pdVar14 = pdVar14 + lVar33;
    pdVar19 = pdVar19 + lVar31;
  }
  lVar23 = lVar32 + -1;
  iVar11 = (iVar6 + 1) / 2;
  lVar41 = (long)iVar11;
  lVar17 = lVar25 * 2 + 1;
  lVar34 = lVar17 * lVar33;
  pdVar13 = ch1 + lVar34 + 2;
  lVar45 = lVar25 * lVar33;
  lVar17 = lVar17 * lVar31;
  pdVar19 = cc1 + lVar27 + lVar17;
  lVar46 = lVar25 * lVar31;
  lVar24 = ((long)(iVar6 + 2) + -2) * lVar25 + 1;
  lVar26 = lVar24 * lVar33;
  pdVar40 = ch1 + lVar26 + 2;
  lVar24 = lVar24 * lVar31;
  pdVar14 = cc1 + lVar27 + lVar24;
  for (lVar47 = 2; lVar47 <= lVar41; lVar47 = lVar47 + 1) {
    lVar42 = 0x10;
    pdVar12 = pdVar13;
    pdVar29 = pdVar40;
    uVar37 = uVar36;
    while (bVar48 = uVar37 != 0, uVar37 = uVar37 - 1, bVar48) {
      pdVar12[lVar43 + -1] =
           *(double *)((long)pdVar19 + lVar42 + -8) + *(double *)((long)pdVar14 + lVar42 + -8);
      pdVar29[lVar43 + -1] =
           *(double *)((long)pdVar19 + lVar42 + -8) - *(double *)((long)pdVar14 + lVar42 + -8);
      pdVar12[lVar43] = *(double *)((long)pdVar19 + lVar42) + *(double *)((long)pdVar14 + lVar42);
      pdVar29[lVar43] = *(double *)((long)pdVar19 + lVar42) - *(double *)((long)pdVar14 + lVar42);
      pdVar12 = pdVar12 + lVar33;
      lVar42 = lVar42 + lVar1;
      pdVar29 = pdVar29 + lVar33;
    }
    pdVar13 = pdVar13 + lVar45;
    pdVar19 = pdVar19 + lVar46;
    pdVar40 = pdVar40 + -lVar45;
    pdVar14 = pdVar14 + -lVar46;
  }
  pdVar14 = ch1 + lVar34 + lVar43 + 2;
  for (lVar47 = 2; pdVar19 = cc1 + lVar27 + lVar16 + 2, pdVar13 = pdVar14, uVar37 = uVar36,
      lVar47 <= lVar41; lVar47 = lVar47 + 1) {
    while (bVar48 = uVar37 != 0, uVar37 = uVar37 - 1, bVar48) {
      pdVar19[-1] = pdVar13[-1] + pdVar19[-1];
      *pdVar19 = *pdVar13 + *pdVar19;
      pdVar13 = pdVar13 + lVar33;
      pdVar19 = pdVar19 + lVar31;
    }
    pdVar14 = pdVar14 + lVar45;
  }
  iVar10 = (int)lVar23 * 2;
  pdVar19 = cc1 + lVar27 + lVar17;
  pdVar14 = cc1 + lVar27 + lVar24;
  for (lVar47 = 2; lVar47 <= lVar41; lVar47 = lVar47 + 1) {
    lVar42 = (lVar23 + lVar47 + -1) * lVar35;
    lVar18 = (iVar10 + lVar47 + -1) * lVar35;
    lVar38 = 0x10;
    pdVar13 = ch1 + ((long)(int)(iVar6 * uVar7) + 1) * lVar33 + 2;
    uVar37 = uVar36;
    pdVar40 = ch1 + lVar44 + 2;
    pdVar12 = ch1 + ((long)(int)(uVar7 * 2) + 1) * lVar33 + 2;
    while (bVar48 = uVar37 != 0, uVar37 = uVar37 - 1, bVar48) {
      *(double *)((long)pdVar19 + lVar38 + -8) =
           wa[(long)(int)uVar30 + lVar42 + 1] * pdVar12[lVar43 + -1] + pdVar40[lVar43 + -1];
      *(double *)((long)pdVar14 + lVar38 + -8) =
           -wa[(long)(int)uVar30 + lVar18 + 1] * pdVar13[lVar43 + -1];
      *(double *)((long)pdVar19 + lVar38) =
           wa[(long)(int)uVar30 + lVar42 + 1] * pdVar12[lVar43] + pdVar40[lVar43];
      *(double *)((long)pdVar14 + lVar38) = -wa[(long)(int)uVar30 + lVar18 + 1] * pdVar13[lVar43];
      pdVar40 = pdVar40 + lVar33;
      pdVar12 = pdVar12 + lVar33;
      lVar38 = lVar38 + lVar1;
      pdVar13 = pdVar13 + lVar33;
    }
    pdVar13 = ch1 + (lVar25 * 3 + 1) * lVar33 + 2;
    pdVar40 = ch1 + (((long)(iVar6 + 2) + -3) * lVar25 + 1) * lVar33 + 2;
    for (uVar37 = 3; uVar37 != iVar11 + 1; uVar37 = uVar37 + 1) {
      iVar21 = (((int)uVar37 + -1) * ((int)lVar47 + -1)) % iVar6;
      dVar49 = wa[(long)(int)uVar30 + (long)(((int)lVar23 + iVar21) * iVar5) + 1];
      dVar2 = wa[(long)(int)uVar30 + (long)((iVar21 + iVar10) * iVar5) + 1];
      lVar42 = 0x10;
      pdVar12 = pdVar40;
      uVar28 = uVar36;
      pdVar29 = pdVar13;
      while (bVar48 = uVar28 != 0, uVar28 = uVar28 - 1, bVar48) {
        *(double *)((long)pdVar19 + lVar42 + -8) =
             pdVar29[lVar43 + -1] * dVar49 + *(double *)((long)pdVar19 + lVar42 + -8);
        *(double *)((long)pdVar14 + lVar42 + -8) =
             pdVar12[lVar43 + -1] * -dVar2 + *(double *)((long)pdVar14 + lVar42 + -8);
        *(double *)((long)pdVar19 + lVar42) =
             pdVar29[lVar43] * dVar49 + *(double *)((long)pdVar19 + lVar42);
        *(double *)((long)pdVar14 + lVar42) =
             pdVar12[lVar43] * -dVar2 + *(double *)((long)pdVar14 + lVar42);
        pdVar29 = pdVar29 + lVar33;
        lVar42 = lVar42 + lVar1;
        pdVar12 = pdVar12 + lVar33;
      }
      pdVar13 = pdVar13 + lVar45;
      pdVar40 = pdVar40 + -lVar45;
    }
    pdVar19 = pdVar19 + lVar46;
    pdVar14 = pdVar14 + -lVar46;
  }
  if (iVar5 < 2) {
    dVar49 = 1.0 / (double)(int)(iVar6 * uVar8);
    if (*na == 1) {
      pdVar14 = ch1 + lVar44 + lVar43 + 2;
      pdVar19 = cc1 + lVar27 + lVar16 + 2;
      uVar37 = uVar36;
      while (bVar48 = uVar37 != 0, uVar37 = uVar37 - 1, bVar48) {
        pdVar14[-1] = pdVar19[-1] * dVar49;
        *pdVar14 = *pdVar19 * dVar49;
        pdVar14 = pdVar14 + lVar33;
        pdVar19 = pdVar19 + lVar31;
      }
      pdVar14 = ch1 + lVar34 + 2;
      pdVar40 = cc1 + lVar27 + lVar17;
      pdVar19 = ch1 + lVar26 + 2;
      pdVar13 = cc1 + lVar27 + lVar24;
      for (lVar15 = 2; lVar15 <= lVar41; lVar15 = lVar15 + 1) {
        lVar22 = 0x10;
        uVar37 = uVar36;
        pdVar12 = pdVar19;
        pdVar29 = pdVar14;
        while (bVar48 = uVar37 != 0, uVar37 = uVar37 - 1, bVar48) {
          pdVar29[lVar43 + -1] =
               (*(double *)((long)pdVar40 + lVar22 + -8) - *(double *)((long)pdVar13 + lVar22)) *
               dVar49;
          pdVar29[lVar43] =
               (*(double *)((long)pdVar40 + lVar22) + *(double *)((long)pdVar13 + lVar22 + -8)) *
               dVar49;
          pdVar12[lVar43 + -1] =
               (*(double *)((long)pdVar40 + lVar22 + -8) + *(double *)((long)pdVar13 + lVar22)) *
               dVar49;
          pdVar12[lVar43] =
               (*(double *)((long)pdVar40 + lVar22) - *(double *)((long)pdVar13 + lVar22 + -8)) *
               dVar49;
          pdVar29 = pdVar29 + lVar33;
          lVar22 = lVar22 + lVar1;
          pdVar12 = pdVar12 + lVar33;
        }
        pdVar14 = pdVar14 + lVar45;
        pdVar40 = pdVar40 + lVar46;
        pdVar19 = pdVar19 + -lVar45;
        pdVar13 = pdVar13 + -lVar46;
      }
    }
    else {
      pdVar14 = cc1 + lVar27 + lVar16 + 1;
      uVar37 = uVar36;
      while (bVar48 = uVar37 != 0, uVar37 = uVar37 - 1, bVar48) {
        *pdVar14 = *pdVar14 * dVar49;
        pdVar14[1] = pdVar14[1] * dVar49;
        pdVar14 = pdVar14 + lVar31;
      }
      pdVar14 = cc1 + lVar27 + lVar17 + 2;
      pdVar19 = cc1 + lVar27 + lVar24 + 2;
      for (lVar15 = 2; lVar15 <= lVar41; lVar15 = lVar15 + 1) {
        lVar22 = 0;
        uVar37 = uVar36;
        while (bVar48 = uVar37 != 0, uVar37 = uVar37 - 1, bVar48) {
          dVar2 = *(double *)((long)pdVar19 + lVar22);
          dVar3 = *(double *)((long)pdVar14 + lVar22 + -8);
          *(double *)((long)pdVar14 + lVar22 + -8) = (dVar3 - dVar2) * dVar49;
          dVar4 = *(double *)((long)pdVar19 + lVar22 + -8);
          *(double *)((long)pdVar19 + lVar22) =
               (*(double *)((long)pdVar14 + lVar22) - dVar4) * dVar49;
          *(double *)((long)pdVar14 + lVar22) =
               (dVar4 + *(double *)((long)pdVar14 + lVar22)) * dVar49;
          *(double *)((long)pdVar19 + lVar22 + -8) = (dVar3 + dVar2) * dVar49;
          lVar22 = lVar22 + lVar1;
        }
        pdVar14 = pdVar14 + lVar46;
        pdVar19 = pdVar19 + -lVar46;
      }
    }
  }
  else {
    pdVar14 = ch1 + lVar44 + lVar43 + 2;
    pdVar19 = cc1 + lVar27 + lVar16 + 2;
    uVar37 = uVar36;
    while (bVar48 = uVar37 != 0, uVar37 = uVar37 - 1, bVar48) {
      pdVar14[-1] = pdVar19[-1];
      *pdVar14 = *pdVar19;
      pdVar14 = pdVar14 + lVar33;
      pdVar19 = pdVar19 + lVar31;
    }
    pdVar14 = ch1 + lVar34 + 2;
    pdVar40 = cc1 + lVar27 + lVar17;
    pdVar19 = ch1 + lVar26 + 2;
    pdVar13 = cc1 + lVar27 + lVar24;
    for (lVar25 = 2; lVar25 <= lVar41; lVar25 = lVar25 + 1) {
      lVar27 = 0x10;
      uVar37 = uVar36;
      pdVar12 = pdVar19;
      pdVar29 = pdVar14;
      while (bVar48 = uVar37 != 0, uVar37 = uVar37 - 1, bVar48) {
        pdVar29[lVar43 + -1] =
             *(double *)((long)pdVar40 + lVar27 + -8) - *(double *)((long)pdVar13 + lVar27);
        pdVar29[lVar43] =
             *(double *)((long)pdVar40 + lVar27) + *(double *)((long)pdVar13 + lVar27 + -8);
        pdVar12[lVar43 + -1] =
             *(double *)((long)pdVar40 + lVar27 + -8) + *(double *)((long)pdVar13 + lVar27);
        pdVar12[lVar43] =
             *(double *)((long)pdVar40 + lVar27) - *(double *)((long)pdVar13 + lVar27 + -8);
        pdVar29 = pdVar29 + lVar33;
        lVar27 = lVar27 + lVar1;
        pdVar12 = pdVar12 + lVar33;
      }
      pdVar14 = pdVar14 + lVar45;
      pdVar40 = pdVar40 + lVar46;
      pdVar19 = pdVar19 + -lVar45;
      pdVar13 = pdVar13 + -lVar46;
    }
    uVar37 = 0;
    if (0 < (int)uVar8) {
      uVar37 = (ulong)uVar8;
    }
    pdVar19 = ch + ((lVar35 + 1) * lVar39 + 1) * lVar33 + lVar15 + 2;
    lVar25 = lVar39 * lVar33;
    pdVar14 = cc + ((lVar32 + 1) * lVar39 + 1) * lVar31 + lVar22 + 2;
    for (uVar36 = 1; pdVar13 = pdVar14, pdVar40 = pdVar19, uVar28 = uVar37, uVar36 != uVar20;
        uVar36 = uVar36 + 1) {
      while (uVar28 != 0) {
        pdVar13[-1] = pdVar40[-1];
        *pdVar13 = *pdVar40;
        pdVar13 = pdVar13 + lVar31;
        pdVar40 = pdVar40 + lVar33;
        uVar28 = uVar28 - 1;
      }
      pdVar19 = pdVar19 + lVar25;
      pdVar14 = pdVar14 + lVar32 * lVar39 * lVar31;
    }
    pdVar19 = ch + ((lVar35 * 2 + 1) * lVar39 + 1) * lVar33 + lVar15 + 2;
    pdVar14 = cc + lVar22 + ((lVar32 + 2) * lVar39 + 1) * lVar31 + 2;
    lVar27 = lVar39 * lVar31;
    for (lVar43 = 2; pdVar13 = pdVar14, uVar36 = uVar37, pdVar40 = pdVar19, lVar43 <= lVar32;
        lVar43 = lVar43 + 1) {
      while (bVar48 = uVar36 != 0, uVar36 = uVar36 - 1, bVar48) {
        pdVar13[-1] = pdVar40[-1];
        *pdVar13 = *pdVar40;
        pdVar40 = pdVar40 + lVar33;
        pdVar13 = pdVar13 + lVar31;
      }
      pdVar19 = pdVar19 + lVar35 * lVar39 * lVar33;
      pdVar14 = pdVar14 + lVar27;
    }
    pdVar14 = ch + ((lVar35 * 2 + 2) * lVar39 + 1) * lVar33 + lVar15 + 2;
    pdVar19 = cc + lVar22 + ((lVar32 * 2 + 2) * lVar39 + 1) * lVar31 + 2;
    for (lVar15 = 2; lVar15 <= lVar32; lVar15 = lVar15 + 1) {
      lVar22 = (lVar23 + lVar15 + -1) * lVar35;
      lVar39 = (iVar10 + lVar15 + -1) * lVar35;
      pdVar13 = pdVar14;
      pdVar40 = pdVar19;
      for (uVar36 = 2; uVar28 = uVar37, pdVar12 = pdVar13, pdVar29 = pdVar40, uVar36 != uVar20;
          uVar36 = uVar36 + 1) {
        while (uVar28 != 0) {
          pdVar29[-1] = wa[(long)(int)uVar30 + lVar22 + uVar36] * pdVar12[-1] +
                        wa[(long)(int)uVar30 + lVar39 + uVar36] * *pdVar12;
          *pdVar29 = wa[(long)(int)uVar30 + lVar22 + uVar36] * *pdVar12 -
                     pdVar12[-1] * wa[(long)(int)uVar30 + lVar39 + uVar36];
          uVar28 = uVar28 - 1;
          pdVar12 = pdVar12 + lVar33;
          pdVar29 = pdVar29 + lVar31;
        }
        pdVar13 = pdVar13 + lVar25;
        pdVar40 = pdVar40 + lVar27 * lVar32;
      }
      pdVar14 = pdVar14 + lVar25 * lVar35;
      pdVar19 = pdVar19 + lVar27;
    }
  }
  return 0;
}

Assistant:

int c1fgkf_(int *ido, int *ip, int *l1, int *
	lid, int *na, fft_real_t *cc, fft_real_t *cc1, int *in1, fft_real_t *ch, fft_real_t *
	ch1, int *in2, fft_real_t *wa)
{
    /* System generated locals */
    int ch_dim1, ch_dim2, ch_dim3, ch_offset, cc_dim1, cc_dim2, cc_dim3,
	    cc_offset, cc1_dim1, cc1_dim2, cc1_offset, ch1_dim1, ch1_dim2,
	    ch1_offset, wa_dim1, wa_dim2, wa_offset, i__1, i__2, i__3;

    /* Local variables */
     int i__, j, k, l, jc, lc, ki;
     fft_real_t sn, wai, war;
     int ipp2, idlj, ipph;
     fft_real_t chold1, chold2;


/* FFTPACK 5.1 auxiliary routine */

    /* Parameter adjustments */
    wa_dim1 = *ido;
    wa_dim2 = *ip - 1;
    wa_offset = 1 + wa_dim1 * (1 + wa_dim2);
    wa -= wa_offset;
    cc1_dim1 = *in1;
    cc1_dim2 = *lid;
    cc1_offset = 1 + cc1_dim1 * (1 + cc1_dim2);
    cc1 -= cc1_offset;
    cc_dim1 = *in1;
    cc_dim2 = *l1;
    cc_dim3 = *ip;
    cc_offset = 1 + cc_dim1 * (1 + cc_dim2 * (1 + cc_dim3));
    cc -= cc_offset;
    ch1_dim1 = *in2;
    ch1_dim2 = *lid;
    ch1_offset = 1 + ch1_dim1 * (1 + ch1_dim2);
    ch1 -= ch1_offset;
    ch_dim1 = *in2;
    ch_dim2 = *l1;
    ch_dim3 = *ido;
    ch_offset = 1 + ch_dim1 * (1 + ch_dim2 * (1 + ch_dim3));
    ch -= ch_offset;

    /* Function Body */
    ipp2 = *ip + 2;
    ipph = (*ip + 1) / 2;
    i__1 = *lid;
    for (ki = 1; ki <= i__1; ++ki) {
	ch1[(ki + ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + cc1_dim2) * cc1_dim1
		+ 1];
	ch1[(ki + ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + cc1_dim2) * cc1_dim1
		+ 2];
/* L110: */
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    ch1[(ki + j * ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + j * cc1_dim2)
		    * cc1_dim1 + 1] + cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 1]
		    ;
	    ch1[(ki + jc * ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + j * cc1_dim2)
		     * cc1_dim1 + 1] - cc1[(ki + jc * cc1_dim2) * cc1_dim1 +
		    1];
	    ch1[(ki + j * ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + j * cc1_dim2)
		    * cc1_dim1 + 2] + cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 2]
		    ;
	    ch1[(ki + jc * ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + j * cc1_dim2)
		     * cc1_dim1 + 2] - cc1[(ki + jc * cc1_dim2) * cc1_dim1 +
		    2];
/* L112: */
	}
/* L111: */
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    cc1[(ki + cc1_dim2) * cc1_dim1 + 1] += ch1[(ki + j * ch1_dim2) *
		    ch1_dim1 + 1];
	    cc1[(ki + cc1_dim2) * cc1_dim1 + 2] += ch1[(ki + j * ch1_dim2) *
		    ch1_dim1 + 2];
/* L117: */
	}
/* L118: */
    }
    i__1 = ipph;
    for (l = 2; l <= i__1; ++l) {
	lc = ipp2 - l;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    cc1[(ki + l * cc1_dim2) * cc1_dim1 + 1] = ch1[(ki + ch1_dim2) *
		    ch1_dim1 + 1] + wa[(l - 1 + wa_dim2) * wa_dim1 + 1] * ch1[
		    (ki + (ch1_dim2 << 1)) * ch1_dim1 + 1];
	    cc1[(ki + lc * cc1_dim2) * cc1_dim1 + 1] = -wa[(l - 1 + (wa_dim2
		    << 1)) * wa_dim1 + 1] * ch1[(ki + *ip * ch1_dim2) *
		    ch1_dim1 + 1];
	    cc1[(ki + l * cc1_dim2) * cc1_dim1 + 2] = ch1[(ki + ch1_dim2) *
		    ch1_dim1 + 2] + wa[(l - 1 + wa_dim2) * wa_dim1 + 1] * ch1[
		    (ki + (ch1_dim2 << 1)) * ch1_dim1 + 2];
	    cc1[(ki + lc * cc1_dim2) * cc1_dim1 + 2] = -wa[(l - 1 + (wa_dim2
		    << 1)) * wa_dim1 + 1] * ch1[(ki + *ip * ch1_dim2) *
		    ch1_dim1 + 2];
/* L113: */
	}
	i__2 = ipph;
	for (j = 3; j <= i__2; ++j) {
	    jc = ipp2 - j;
	    idlj = (l - 1) * (j - 1) % *ip;
	    war = wa[(idlj + wa_dim2) * wa_dim1 + 1];
	    wai = -wa[(idlj + (wa_dim2 << 1)) * wa_dim1 + 1];
	    i__3 = *lid;
	    for (ki = 1; ki <= i__3; ++ki) {
		cc1[(ki + l * cc1_dim2) * cc1_dim1 + 1] += war * ch1[(ki + j *
			 ch1_dim2) * ch1_dim1 + 1];
		cc1[(ki + lc * cc1_dim2) * cc1_dim1 + 1] += wai * ch1[(ki +
			jc * ch1_dim2) * ch1_dim1 + 1];
		cc1[(ki + l * cc1_dim2) * cc1_dim1 + 2] += war * ch1[(ki + j *
			 ch1_dim2) * ch1_dim1 + 2];
		cc1[(ki + lc * cc1_dim2) * cc1_dim1 + 2] += wai * ch1[(ki +
			jc * ch1_dim2) * ch1_dim1 + 2];
/* L114: */
	    }
/* L115: */
	}
/* L116: */
    }
    if (*ido > 1) {
	goto L136;
    }
    sn = 1.0 / (fft_real_t) (*ip * *l1);
    if (*na == 1) {
	goto L146;
    }
    i__1 = *lid;
    for (ki = 1; ki <= i__1; ++ki) {
	cc1[(ki + cc1_dim2) * cc1_dim1 + 1] = sn * cc1[(ki + cc1_dim2) *
		cc1_dim1 + 1];
	cc1[(ki + cc1_dim2) * cc1_dim1 + 2] = sn * cc1[(ki + cc1_dim2) *
		cc1_dim1 + 2];
/* L149: */
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    chold1 = sn * (cc1[(ki + j * cc1_dim2) * cc1_dim1 + 1] - cc1[(ki
		    + jc * cc1_dim2) * cc1_dim1 + 2]);
	    chold2 = sn * (cc1[(ki + j * cc1_dim2) * cc1_dim1 + 1] + cc1[(ki
		    + jc * cc1_dim2) * cc1_dim1 + 2]);
	    cc1[(ki + j * cc1_dim2) * cc1_dim1 + 1] = chold1;
	    cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 2] = sn * (cc1[(ki + j *
		    cc1_dim2) * cc1_dim1 + 2] - cc1[(ki + jc * cc1_dim2) *
		    cc1_dim1 + 1]);
	    cc1[(ki + j * cc1_dim2) * cc1_dim1 + 2] = sn * (cc1[(ki + j *
		    cc1_dim2) * cc1_dim1 + 2] + cc1[(ki + jc * cc1_dim2) *
		    cc1_dim1 + 1]);
	    cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 1] = chold2;
/* L119: */
	}
/* L120: */
    }
    return 0;
L146:
    i__1 = *lid;
    for (ki = 1; ki <= i__1; ++ki) {
	ch1[(ki + ch1_dim2) * ch1_dim1 + 1] = sn * cc1[(ki + cc1_dim2) *
		cc1_dim1 + 1];
	ch1[(ki + ch1_dim2) * ch1_dim1 + 2] = sn * cc1[(ki + cc1_dim2) *
		cc1_dim1 + 2];
/* L147: */
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    ch1[(ki + j * ch1_dim2) * ch1_dim1 + 1] = sn * (cc1[(ki + j *
		    cc1_dim2) * cc1_dim1 + 1] - cc1[(ki + jc * cc1_dim2) *
		    cc1_dim1 + 2]);
	    ch1[(ki + j * ch1_dim2) * ch1_dim1 + 2] = sn * (cc1[(ki + j *
		    cc1_dim2) * cc1_dim1 + 2] + cc1[(ki + jc * cc1_dim2) *
		    cc1_dim1 + 1]);
	    ch1[(ki + jc * ch1_dim2) * ch1_dim1 + 1] = sn * (cc1[(ki + j *
		    cc1_dim2) * cc1_dim1 + 1] + cc1[(ki + jc * cc1_dim2) *
		    cc1_dim1 + 2]);
	    ch1[(ki + jc * ch1_dim2) * ch1_dim1 + 2] = sn * (cc1[(ki + j *
		    cc1_dim2) * cc1_dim1 + 2] - cc1[(ki + jc * cc1_dim2) *
		    cc1_dim1 + 1]);
/* L144: */
	}
/* L145: */
    }
    return 0;
L136:
    i__1 = *lid;
    for (ki = 1; ki <= i__1; ++ki) {
	ch1[(ki + ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + cc1_dim2) * cc1_dim1
		+ 1];
	ch1[(ki + ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + cc1_dim2) * cc1_dim1
		+ 2];
/* L137: */
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    ch1[(ki + j * ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + j * cc1_dim2)
		    * cc1_dim1 + 1] - cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 2]
		    ;
	    ch1[(ki + j * ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + j * cc1_dim2)
		    * cc1_dim1 + 2] + cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 1]
		    ;
	    ch1[(ki + jc * ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + j * cc1_dim2)
		     * cc1_dim1 + 1] + cc1[(ki + jc * cc1_dim2) * cc1_dim1 +
		    2];
	    ch1[(ki + jc * ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + j * cc1_dim2)
		     * cc1_dim1 + 2] - cc1[(ki + jc * cc1_dim2) * cc1_dim1 +
		    1];
/* L134: */
	}
/* L135: */
    }
    i__1 = *ido;
    for (i__ = 1; i__ <= i__1; ++i__) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    cc[(k + (i__ * cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] = ch[(k + (
		    i__ + ch_dim3) * ch_dim2) * ch_dim1 + 1];
	    cc[(k + (i__ * cc_dim3 + 1) * cc_dim2) * cc_dim1 + 2] = ch[(k + (
		    i__ + ch_dim3) * ch_dim2) * ch_dim1 + 2];
/* L130: */
	}
/* L131: */
    }
    i__1 = *ip;
    for (j = 2; j <= i__1; ++j) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    cc[(k + (j + cc_dim3) * cc_dim2) * cc_dim1 + 1] = ch[(k + (j *
		    ch_dim3 + 1) * ch_dim2) * ch_dim1 + 1];
	    cc[(k + (j + cc_dim3) * cc_dim2) * cc_dim1 + 2] = ch[(k + (j *
		    ch_dim3 + 1) * ch_dim2) * ch_dim1 + 2];
/* L122: */
	}
/* L123: */
    }
    i__1 = *ip;
    for (j = 2; j <= i__1; ++j) {
	i__2 = *ido;
	for (i__ = 2; i__ <= i__2; ++i__) {
	    i__3 = *l1;
	    for (k = 1; k <= i__3; ++k) {
		cc[(k + (j + i__ * cc_dim3) * cc_dim2) * cc_dim1 + 1] = wa[
			i__ + (j - 1 + wa_dim2) * wa_dim1] * ch[(k + (i__ + j
			* ch_dim3) * ch_dim2) * ch_dim1 + 1] + wa[i__ + (j -
			1 + (wa_dim2 << 1)) * wa_dim1] * ch[(k + (i__ + j *
			ch_dim3) * ch_dim2) * ch_dim1 + 2];
		cc[(k + (j + i__ * cc_dim3) * cc_dim2) * cc_dim1 + 2] = wa[
			i__ + (j - 1 + wa_dim2) * wa_dim1] * ch[(k + (i__ + j
			* ch_dim3) * ch_dim2) * ch_dim1 + 2] - wa[i__ + (j -
			1 + (wa_dim2 << 1)) * wa_dim1] * ch[(k + (i__ + j *
			ch_dim3) * ch_dim2) * ch_dim1 + 1];
/* L124: */
	    }
/* L125: */
	}
/* L126: */
    }
    return 0;
}